

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIComboBox.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIComboBox::draw(CGUIComboBox *this)

{
  IGUIFont *pIVar1;
  IGUIStaticText *pIVar2;
  IGUIButton *pIVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  s32 width;
  uint uVar7;
  uint uVar8;
  undefined4 uVar9;
  long *plVar10;
  IGUIFont *pIVar11;
  CGUIComboBox *child;
  int iVar12;
  rect<int> frameRect;
  
  if (this->field_0xa0 == '\x01') {
    plVar10 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    width = (**(code **)(*plVar10 + 0x10))(plVar10,0);
    updateListButtonWidth(this,width);
    pIVar1 = this->ActiveFont;
    pIVar11 = (IGUIFont *)(**(code **)(*plVar10 + 0x30))(plVar10,0);
    if ((pIVar1 != pIVar11) && (this->ListBox != (IGUIListBox *)0x0)) {
      openCloseMenu(this);
      openCloseMenu(this);
    }
    child = (CGUIComboBox *)(**(code **)(**(long **)&this->field_0x128 + 0x10))();
    if (child != (CGUIComboBox *)this->LastFocus) {
      if (child == this) {
        bVar4 = true;
      }
      else {
        bVar4 = IGUIElement::isMyChild((IGUIElement *)this,(IGUIElement *)child);
      }
      this->HasFocus = bVar4;
      this->LastFocus = (IGUIElement *)child;
    }
    pIVar2 = this->SelectedText;
    uVar7 = (**(code **)*plVar10)(plVar10,10);
    (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2c])
              (pIVar2,(ulong)uVar7);
    cVar5 = (**(code **)(*(long *)this + 0x90))(this);
    pIVar2 = this->SelectedText;
    if (cVar5 == '\0') {
      (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2d])(pIVar2,0);
      iVar12 = 9;
    }
    else {
      (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2d])
                (pIVar2,(ulong)this->HasFocus);
      iVar12 = (uint)this->HasFocus + (uint)this->HasFocus * 2 + 8;
    }
    pIVar2 = this->SelectedText;
    uVar7 = (**(code **)*plVar10)(plVar10,iVar12);
    (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x27])
              (pIVar2,(ulong)uVar7);
    pIVar3 = this->ListButton;
    uVar7 = (**(code **)(*plVar10 + 0x50))(plVar10,6);
    bVar6 = (**(code **)(*(long *)this + 0x90))(this);
    uVar8 = (**(code **)*plVar10)(plVar10,(uint)(bVar6 ^ 1) + (uint)(bVar6 ^ 1) * 2 + 0x12);
    (*(pIVar3->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
              (pIVar3,0,(ulong)uVar7,(ulong)uVar8,0,0);
    pIVar3 = this->ListButton;
    uVar7 = (**(code **)(*plVar10 + 0x50))(plVar10,6);
    bVar6 = (**(code **)(*(long *)this + 0x90))(this);
    uVar8 = (**(code **)*plVar10)(plVar10,(uint)(bVar6 ^ 1) + (uint)(bVar6 ^ 1) * 2 + 0x12);
    (*(pIVar3->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x32])
              (pIVar3,1,(ulong)uVar7,(ulong)uVar8,0,0);
    frameRect.UpperLeftCorner.X = *(int *)&this->field_0x40;
    frameRect.UpperLeftCorner.Y = *(int *)&this->field_0x44;
    frameRect.LowerRightCorner.X = *(int *)&this->field_0x48;
    frameRect.LowerRightCorner.Y = *(int *)&this->field_0x4c;
    uVar9 = (**(code **)*plVar10)(plVar10,3);
    (**(code **)(*plVar10 + 0x70))(plVar10,this,uVar9,1,1,&frameRect,&this->field_0x50);
    IGUIElement::draw((IGUIElement *)this);
  }
  return;
}

Assistant:

void CGUIComboBox::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();

	updateListButtonWidth(skin->getSize(EGDS_SCROLLBAR_SIZE));

	// font changed while the listbox is open?
	if (ActiveFont != skin->getFont() && ListBox) {
		// close and re-open to use new font-size
		openCloseMenu();
		openCloseMenu();
	}

	IGUIElement *currentFocus = Environment->getFocus();
	if (currentFocus != LastFocus) {
		HasFocus = currentFocus == this || isMyChild(currentFocus);
		LastFocus = currentFocus;
	}

	// set colors each time as skin-colors can be changed
	SelectedText->setBackgroundColor(skin->getColor(EGDC_HIGH_LIGHT));
	if (isEnabled()) {
		SelectedText->setDrawBackground(HasFocus);
		SelectedText->setOverrideColor(skin->getColor(HasFocus ? EGDC_HIGH_LIGHT_TEXT : EGDC_BUTTON_TEXT));
	} else {
		SelectedText->setDrawBackground(false);
		SelectedText->setOverrideColor(skin->getColor(EGDC_GRAY_TEXT));
	}
	ListButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_DOWN), skin->getColor(isEnabled() ? EGDC_WINDOW_SYMBOL : EGDC_GRAY_WINDOW_SYMBOL));
	ListButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_DOWN), skin->getColor(isEnabled() ? EGDC_WINDOW_SYMBOL : EGDC_GRAY_WINDOW_SYMBOL));

	core::rect<s32> frameRect(AbsoluteRect);

	// draw the border

	skin->draw3DSunkenPane(this, skin->getColor(EGDC_3D_HIGH_LIGHT),
			true, true, frameRect, &AbsoluteClippingRect);

	// draw children
	IGUIElement::draw();
}